

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMesh.cpp
# Opt level: O3

int __thiscall
cbtTriangleMesh::findOrAddVertex
          (cbtTriangleMesh *this,cbtVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtVector3 *ptr;
  cbtIndexedMesh *pcVar4;
  float fVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  cbtVector3 *pcVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  cbtScalar *pcVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (this->m_use4componentVertices == true) {
    uVar7 = (this->m_4componentVertices).m_size;
    if (removeDuplicateVertices && 0 < (int)uVar7) {
      uVar9 = 0;
      pcVar16 = ((this->m_4componentVertices).m_data)->m_floats + 2;
      do {
        fVar5 = pcVar16[-1] - vertex->m_floats[1];
        auVar20 = ZEXT416((uint)(((cbtVector3 *)(pcVar16 + -2))->m_floats[0] - vertex->m_floats[0]))
        ;
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar20,auVar20);
        auVar21 = ZEXT416((uint)(*pcVar16 - vertex->m_floats[2]));
        auVar20 = vfmadd231ss_fma(auVar20,auVar21,auVar21);
        if (auVar20._0_4_ <= this->m_weldingThreshold) goto LAB_008cc1aa;
        uVar9 = uVar9 + 1;
        pcVar16 = pcVar16 + 4;
      } while (uVar7 != uVar9);
    }
    piVar1 = &((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    if (uVar7 == (this->m_4componentVertices).m_capacity) {
      iVar8 = 1;
      if (uVar7 != 0) {
        iVar8 = uVar7 * 2;
      }
      if ((int)uVar7 < iVar8) {
        if (iVar8 == 0) {
          pcVar10 = (cbtVector3 *)0x0;
        }
        else {
          pcVar10 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar8 << 4,0x10);
          uVar7 = (this->m_4componentVertices).m_size;
        }
        if (0 < (int)uVar7) {
          lVar13 = 0;
          do {
            puVar2 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar13);
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)((long)pcVar10->m_floats + lVar13);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)uVar7 << 4 != lVar13);
        }
        ptr = (this->m_4componentVertices).m_data;
        if ((ptr != (cbtVector3 *)0x0) && ((this->m_4componentVertices).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_4componentVertices).m_ownsMemory = true;
        (this->m_4componentVertices).m_data = pcVar10;
        (this->m_4componentVertices).m_capacity = iVar8;
        uVar7 = (this->m_4componentVertices).m_size;
      }
    }
    uVar6 = *(undefined8 *)(vertex->m_floats + 2);
    pcVar10 = (this->m_4componentVertices).m_data + (int)uVar7;
    *(undefined8 *)pcVar10->m_floats = *(undefined8 *)vertex->m_floats;
    *(undefined8 *)(pcVar10->m_floats + 2) = uVar6;
    uVar7 = (this->m_4componentVertices).m_size;
    uVar9 = (ulong)uVar7;
    (this->m_4componentVertices).m_size = uVar7 + 1;
    ((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
    goto LAB_008cc1aa;
  }
  uVar7 = (this->m_3componentVertices).m_size;
  if (removeDuplicateVertices && 0 < (int)uVar7) {
    pfVar11 = (this->m_3componentVertices).m_data;
    uVar9 = 0;
    do {
      fVar5 = pfVar11[uVar9 + 1] - vertex->m_floats[1];
      auVar20 = ZEXT416((uint)(pfVar11[uVar9] - vertex->m_floats[0]));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar20,auVar20);
      auVar21 = ZEXT416((uint)(pfVar11[uVar9 + 2] - vertex->m_floats[2]));
      auVar20 = vfmadd231ss_fma(auVar20,auVar21,auVar21);
      if (auVar20._0_4_ <= this->m_weldingThreshold) {
        uVar9 = (uVar9 & 0xffffffff) / 3;
        goto LAB_008cc1aa;
      }
      uVar9 = uVar9 + 3;
    } while ((int)uVar9 < (int)uVar7);
  }
  uVar18 = (this->m_3componentVertices).m_capacity;
  if (uVar7 == uVar18) {
    uVar17 = 1;
    if (uVar7 != 0) {
      uVar17 = uVar7 * 2;
    }
    uVar18 = uVar7;
    if ((int)uVar7 < (int)uVar17) {
      if (uVar17 == 0) {
        pfVar11 = (float *)0x0;
      }
      else {
        pfVar11 = (float *)cbtAlignedAllocInternal((long)(int)uVar17 << 2,0x10);
        uVar7 = (this->m_3componentVertices).m_size;
      }
      pfVar12 = (this->m_3componentVertices).m_data;
      if ((int)uVar7 < 1) {
        if (pfVar12 != (float *)0x0) goto LAB_008cbfcc;
      }
      else {
        uVar9 = 0;
        do {
          pfVar11[uVar9] = pfVar12[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
LAB_008cbfcc:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pfVar12);
          uVar7 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar11;
      (this->m_3componentVertices).m_capacity = uVar17;
      uVar18 = uVar17;
    }
  }
  pfVar11 = (this->m_3componentVertices).m_data;
  pfVar11[(int)uVar7] = vertex->m_floats[0];
  uVar7 = uVar7 + 1;
  (this->m_3componentVertices).m_size = uVar7;
  if (uVar7 == uVar18) {
    uVar9 = 1;
    if (uVar18 != 0) {
      uVar9 = (ulong)(uVar18 * 2);
    }
    iVar8 = (int)uVar9;
    if ((int)uVar18 < iVar8) {
      if (iVar8 == 0) {
        pfVar12 = (float *)0x0;
      }
      else {
        pfVar12 = (float *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        uVar18 = (this->m_3componentVertices).m_size;
        pfVar11 = (this->m_3componentVertices).m_data;
      }
      if ((int)uVar18 < 1) {
        if (pfVar11 != (float *)0x0) goto LAB_008cc08b;
      }
      else {
        uVar14 = 0;
        do {
          pfVar12[uVar14] = pfVar11[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar18 != uVar14);
LAB_008cc08b:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pfVar11);
          uVar18 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar12;
      (this->m_3componentVertices).m_capacity = iVar8;
      pfVar11 = pfVar12;
    }
    else {
      uVar9 = (ulong)uVar18;
    }
  }
  else {
    uVar9 = (ulong)uVar18;
    uVar18 = uVar7;
  }
  pfVar11[(int)uVar18] = vertex->m_floats[1];
  iVar8 = uVar18 + 1;
  (this->m_3componentVertices).m_size = iVar8;
  iVar19 = (int)uVar9;
  if (iVar8 == iVar19) {
    iVar15 = 1;
    if (iVar19 != 0) {
      iVar15 = iVar19 * 2;
    }
    iVar8 = iVar19;
    if (iVar19 < iVar15) {
      if (iVar15 == 0) {
        pfVar12 = (float *)0x0;
      }
      else {
        pfVar12 = (float *)cbtAlignedAllocInternal((long)iVar15 << 2,0x10);
        uVar9 = (ulong)(uint)(this->m_3componentVertices).m_size;
        pfVar11 = (this->m_3componentVertices).m_data;
      }
      iVar8 = (int)uVar9;
      if (iVar8 < 1) {
        if (pfVar11 != (float *)0x0) goto LAB_008cc142;
      }
      else {
        uVar14 = 0;
        do {
          pfVar12[uVar14] = pfVar11[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
LAB_008cc142:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pfVar11);
          iVar8 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar12;
      (this->m_3componentVertices).m_capacity = iVar15;
      pfVar11 = pfVar12;
    }
  }
  pfVar11[iVar8] = vertex->m_floats[2];
  (this->m_3componentVertices).m_size = iVar8 + 1;
  pcVar4 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  piVar1 = &pcVar4->m_numVertices;
  *piVar1 = *piVar1 + 1;
  pcVar4->m_vertexBase = (uchar *)pfVar11;
  uVar9 = (ulong)((iVar8 + 1) / 3 - 1);
LAB_008cc1aa:
  return (int)uVar9;
}

Assistant:

int cbtTriangleMesh::findOrAddVertex(const cbtVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_4componentVertices.size(); i++)
			{
				if ((m_4componentVertices[i] - vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size() - 1;
	}
	else
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_3componentVertices.size(); i += 3)
			{
				cbtVector3 vtx(m_3componentVertices[i], m_3componentVertices[i + 1], m_3componentVertices[i + 2]);
				if ((vtx - vertex).length2() <= m_weldingThreshold)
				{
					return i / 3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size() / 3) - 1;
	}
}